

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

ssize_t __thiscall directory::read(directory *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  long lVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  int i;
  ulong uVar4;
  allocator_type local_49;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  lVar2 = 0;
  std::istream::seekg(pcVar3,0,0);
  std::istream::read(pcVar3,(long)this);
  std::istream::read(pcVar3,(long)&this->bucket_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
             (ulong)this->bucket_size,&local_49);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->bucket_ids,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  for (uVar4 = 0; uVar1 = (ulong)this->bucket_size, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    std::istream::read(pcVar3,(long)(this->bucket_ids).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar2);
    lVar2 = lVar2 + 4;
  }
  return uVar1;
}

Assistant:

void directory::read(std::fstream &stream) {
    stream.seekg(0);

    stream.read((char *) &depth, DEPTHS);
    stream.read((char *) &bucket_size, BUCKET_SIZE);
    this->bucket_ids = vector<uint32_t>(bucket_size);

    for (int i = 0; i < bucket_size; ++i) {
        stream.read((char *) &bucket_ids[i], BUCKET_ID);
    }
}